

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Axis v)

{
  allocator *paVar1;
  int iVar2;
  char *pcVar3;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar3 = "Z";
    paVar1 = &local_b;
  }
  else if (iVar2 == 1) {
    pcVar3 = "Y";
    paVar1 = &local_a;
  }
  else if (iVar2 == 0) {
    pcVar3 = "X";
    paVar1 = &local_9;
  }
  else {
    pcVar3 = "[[InvalidAxis]]";
    paVar1 = &local_c;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Axis v) {
  if (v == tinyusdz::Axis::X) {
    return "X";
  } else if (v == tinyusdz::Axis::Y) {
    return "Y";
  } else if (v == tinyusdz::Axis::Z) {
    return "Z";
  } else {
    return "[[InvalidAxis]]";
  }
}